

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O0

void clone_loadbang(t_clone *x,t_floatarg f)

{
  int local_18;
  int i;
  t_floatarg f_local;
  t_clone *x_local;
  
  if ((f != 0.0) || (NAN(f))) {
    if ((f == 2.0) && (!NAN(f))) {
      for (local_18 = 0; local_18 < x->x_n; local_18 = local_18 + 1) {
        canvas_closebang(x->x_vec[local_18].c_gl);
      }
    }
  }
  else {
    for (local_18 = 0; local_18 < x->x_n; local_18 = local_18 + 1) {
      canvas_loadbang(x->x_vec[local_18].c_gl);
    }
  }
  return;
}

Assistant:

static void clone_loadbang(t_clone *x, t_floatarg f)
{
    int i;
    if (f == LB_LOAD)
        for (i = 0; i < x->x_n; i++)
            canvas_loadbang(x->x_vec[i].c_gl);
    else if (f == LB_CLOSE)
        for (i = 0; i < x->x_n; i++)
            canvas_closebang(x->x_vec[i].c_gl);
}